

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O1

void __thiscall
SGParser::Parse<SGParser::ParseStackGenericElement>::Parse
          (Parse<SGParser::ParseStackGenericElement> *this,ParseTable *ptable,size_t stackSize)

{
  this->pParseTable = (ParseTable *)0x0;
  this->pTokenizer = (TokenStream<SGParser::GenericToken> *)0x0;
  BacktrackingTokenStream<SGParser::GenericToken>::BacktrackingTokenStream(&this->Stream);
  this->pStack = (ParseStackGenericElement *)0x0;
  this->StackPosition = 0;
  this->StackSize = 0;
  this->TopState = 0xffffffff;
  this->NextTokenFlag = false;
  this->PrevTokenIndex = 0xffffffffffffffff;
  (this->Token).super_TokenCode.Code = 1;
  (this->Token).Str._M_dataplus._M_p = (pointer)&(this->Token).Str.field_2;
  (this->Token).Str._M_string_length = 0;
  (this->Token).Str.field_2._M_local_buf[0] = '\0';
  this->pValidTokenStackPositions = (size_t *)0x0;
  (this->Token).Line = 0;
  (this->Token).Offset = 0;
  this->ReduceLeft = 0;
  this->ErrorMarker = 0xffffffffffffffff;
  this->LastErrorState = 0xffffffff;
  (this->ErrorStackStr)._M_dataplus._M_p = (pointer)&(this->ErrorStackStr).field_2;
  (this->ErrorStackStr)._M_string_length = 0;
  (this->ErrorStackStr).field_2._M_local_buf[0] = '\0';
  Create(this,ptable,stackSize);
  return;
}

Assistant:

explicit Parse(const ParseTable* ptable = nullptr, size_t stackSize = DefaultStackSize) {
        Create(ptable, stackSize);
    }